

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

void release_pending_output_frames(aom_codec_alg_priv_t *ctx)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  size_t j_1;
  size_t j;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  BufferPool *pool;
  BufferPool *in_stack_ffffffffffffffc8;
  ulong uVar3;
  RefCntBuffer *buf;
  
  if (*(long *)(in_RDI + 0x69f0) != 0) {
    lVar1 = *(long *)(in_RDI + 0x6b10);
    lock_buffer_pool((BufferPool *)0x1a6c97);
    lVar2 = **(long **)(*(long *)(in_RDI + 0x69f0) + 0x20);
    for (buf = (RefCntBuffer *)0x0; buf < *(RefCntBuffer **)(lVar2 + 0x58d78);
        buf = (RefCntBuffer *)((long)&buf->ref_count + 1)) {
      decrease_ref_count(buf,in_stack_ffffffffffffffc8);
    }
    *(undefined8 *)(lVar2 + 0x58d78) = 0;
    unlock_buffer_pool((BufferPool *)0x1a6d25);
    for (uVar3 = 0; uVar3 < *(ulong *)(in_RDI + 0x6b00); uVar3 = uVar3 + 1) {
      (**(code **)(lVar1 + 0x38))(*(undefined8 *)(lVar1 + 0x28),in_RDI + 0x6aa0 + uVar3 * 0x18);
      *(undefined8 *)(in_RDI + 0x6aa0 + uVar3 * 0x18) = 0;
      *(undefined8 *)(in_RDI + uVar3 * 0x18 + 0x6aa8) = 0;
      *(undefined8 *)(in_RDI + uVar3 * 0x18 + 0x6ab0) = 0;
    }
    *(undefined8 *)(in_RDI + 0x6b00) = 0;
  }
  return;
}

Assistant:

static void release_pending_output_frames(aom_codec_alg_priv_t *ctx) {
  // Release any pending output frames from the previous decoder_decode or
  // decoder_inspect call. We need to do this even if the decoder is being
  // flushed or the input arguments are invalid.
  if (ctx->frame_worker) {
    BufferPool *const pool = ctx->buffer_pool;
    lock_buffer_pool(pool);
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    struct AV1Decoder *pbi = frame_worker_data->pbi;
    for (size_t j = 0; j < pbi->num_output_frames; j++) {
      decrease_ref_count(pbi->output_frames[j], pool);
    }
    pbi->num_output_frames = 0;
    unlock_buffer_pool(pool);
    for (size_t j = 0; j < ctx->num_grain_image_frame_buffers; j++) {
      pool->release_fb_cb(pool->cb_priv, &ctx->grain_image_frame_buffers[j]);
      ctx->grain_image_frame_buffers[j].data = NULL;
      ctx->grain_image_frame_buffers[j].size = 0;
      ctx->grain_image_frame_buffers[j].priv = NULL;
    }
    ctx->num_grain_image_frame_buffers = 0;
  }
}